

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall SHA256_check::test_method(SHA256_check *this)

{
  undefined8 uVar1;
  __type pv_;
  bool bVar2;
  lazy_ostream *prev;
  basic_cstring<const_char> local_1c8;
  char *local_1b8;
  char *local_1b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]> local_1a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>
  local_188;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>
  local_168;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
  local_148;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_const_char_*,_const_char_*const_&>
  local_128;
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>
  local_108;
  assertion_result local_e8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [8];
  string actual;
  allocator local_79;
  string local_78 [8];
  string expected;
  undefined1 local_58 [8];
  ethash_h256_t out;
  ethash_h256_t input;
  SHA256_check *this_local;
  
  builtin_memcpy(out.b + 0x18,"~~~~~~~~",8);
  SHA3_256((ethash_h256 *)local_58,out.b + 0x18,0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  bytesToHexString_abi_cxx11_((uint8_t *)local_b0,(uint64_t)local_58);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x80,&local_d0);
    pv_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_78,local_b0);
    boost::test_tools::assertion_result::assertion_result(&local_e8,pv_);
    prev = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1a8,prev,(char (*) [12])"\nexpected: ");
    local_1b0 = (char *)std::__cxx11::string::c_str();
    boost::unit_test::operator<<(&local_188,&local_1a8,&local_1b0);
    boost::unit_test::operator<<(&local_168,&local_188,(char (*) [2])0x15b3a8);
    boost::unit_test::operator<<(&local_148,&local_168,(char (*) [9])"actual: ");
    local_1b8 = (char *)std::__cxx11::string::c_str();
    boost::unit_test::operator<<(&local_128,&local_148,&local_1b8);
    boost::unit_test::operator<<(&local_108,&local_128,(char (*) [2])0x15b3a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/ethereum[P]ethash/test/c/test.cpp"
               ,0x53);
    boost::test_tools::tt_detail::report_assertion(&local_e8,&local_108,&local_1c8,0x80,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_108);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>,_const_char_*,_const_char_*const_&>
    ::~lazy_ostream_impl(&local_128);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>,_char[9],_const_char_(&)[9]>
    ::~lazy_ostream_impl(&local_148);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>,_char[2],_const_char_(&)[2]>
    ::~lazy_ostream_impl(&local_168);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>,_const_char_*,_const_char_*const_&>
    ::~lazy_ostream_impl(&local_188);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[12],_const_char_(&)[12]>::
    ~lazy_ostream_impl(&local_1a8);
    boost::test_tools::assertion_result::~assertion_result(&local_e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(SHA256_check) {
	ethash_h256_t input;
	ethash_h256_t out;
	memcpy(&input, "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~", 32);
	SHA3_256(&out, (uint8_t*)&input, 32);
	const std::string
			expected = "2b5ddf6f4d21c23de216f44d5e4bdc68e044b71897837ea74c83908be7037cd7",
		actual = bytesToHexString((uint8_t*)&out, 32);
	BOOST_REQUIRE_MESSAGE(expected == actual,
			"\nexpected: " << expected.c_str() << "\n"
					<< "actual: " << actual.c_str() << "\n");
}